

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe.cpp
# Opt level: O0

void fe_tobytes(uchar *s,i32 *h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  i64 iVar12;
  i32 carry9;
  i32 carry8;
  i32 carry7;
  i32 carry6;
  i32 carry5;
  i32 carry4;
  i32 carry3;
  i32 carry2;
  i32 carry1;
  i32 carry0;
  i32 q;
  i32 h9;
  i32 h8;
  i32 h7;
  i32 h6;
  i32 h5;
  i32 h4;
  i32 h3;
  i32 h2;
  i32 h1;
  i32 h0;
  i32 *h_local;
  uchar *s_local;
  
  iVar4 = h[2];
  iVar5 = h[3];
  iVar6 = h[4];
  iVar7 = h[5];
  iVar8 = h[6];
  iVar9 = h[7];
  iVar10 = h[8];
  iVar11 = h[9];
  iVar1 = (iVar11 + (iVar10 + (iVar9 + (iVar8 + (iVar7 + (iVar6 + (iVar5 + (iVar4 + (h[1] + (*h + (
                                                  iVar11 * 0x13 + 0x1000000 >> 0x19) >> 0x1a) >>
                                                  0x19) >> 0x1a) >> 0x19) >> 0x1a) >> 0x19) >> 0x1a)
                              >> 0x19) >> 0x1a) >> 0x19) * 0x13 + *h;
  iVar2 = iVar1 >> 0x1a;
  iVar3 = iVar2 + h[1];
  iVar12 = shift_left((long)iVar2,0x1a);
  iVar1 = iVar1 - (int)iVar12;
  iVar2 = iVar3 >> 0x19;
  iVar4 = iVar2 + iVar4;
  iVar12 = shift_left((long)iVar2,0x19);
  iVar3 = iVar3 - (int)iVar12;
  iVar2 = iVar4 >> 0x1a;
  iVar5 = iVar2 + iVar5;
  iVar12 = shift_left((long)iVar2,0x1a);
  iVar4 = iVar4 - (int)iVar12;
  iVar2 = iVar5 >> 0x19;
  iVar6 = iVar2 + iVar6;
  iVar12 = shift_left((long)iVar2,0x19);
  iVar5 = iVar5 - (int)iVar12;
  iVar2 = iVar6 >> 0x1a;
  iVar7 = iVar2 + iVar7;
  iVar12 = shift_left((long)iVar2,0x1a);
  iVar6 = iVar6 - (int)iVar12;
  iVar2 = iVar7 >> 0x19;
  iVar8 = iVar2 + iVar8;
  iVar12 = shift_left((long)iVar2,0x19);
  iVar7 = iVar7 - (int)iVar12;
  iVar2 = iVar8 >> 0x1a;
  iVar9 = iVar2 + iVar9;
  iVar12 = shift_left((long)iVar2,0x1a);
  iVar8 = iVar8 - (int)iVar12;
  iVar2 = iVar9 >> 0x19;
  iVar10 = iVar2 + iVar10;
  iVar12 = shift_left((long)iVar2,0x19);
  iVar9 = iVar9 - (int)iVar12;
  iVar2 = iVar10 >> 0x1a;
  iVar11 = iVar2 + iVar11;
  iVar12 = shift_left((long)iVar2,0x1a);
  iVar10 = iVar10 - (int)iVar12;
  iVar12 = shift_left((long)(iVar11 >> 0x19),0x19);
  iVar11 = iVar11 - (int)iVar12;
  *s = (uchar)iVar1;
  s[1] = (uchar)((uint)iVar1 >> 8);
  s[2] = (uchar)((uint)iVar1 >> 0x10);
  s[3] = (byte)((uint)iVar1 >> 0x18) | (char)iVar3 * '\x04';
  s[4] = (uchar)(iVar3 >> 6);
  s[5] = (uchar)(iVar3 >> 0xe);
  s[6] = (byte)(iVar3 >> 0x16) | (char)iVar4 * '\b';
  s[7] = (uchar)(iVar4 >> 5);
  s[8] = (uchar)(iVar4 >> 0xd);
  s[9] = (byte)(iVar4 >> 0x15) | (char)iVar5 * ' ';
  s[10] = (uchar)(iVar5 >> 3);
  s[0xb] = (uchar)(iVar5 >> 0xb);
  s[0xc] = (byte)(iVar5 >> 0x13) | (char)iVar6 * '@';
  s[0xd] = (uchar)(iVar6 >> 2);
  s[0xe] = (uchar)(iVar6 >> 10);
  s[0xf] = (uchar)(iVar6 >> 0x12);
  s[0x10] = (uchar)iVar7;
  s[0x11] = (uchar)((uint)iVar7 >> 8);
  s[0x12] = (uchar)((uint)iVar7 >> 0x10);
  s[0x13] = (byte)((uint)iVar7 >> 0x18) | (char)iVar8 * '\x02';
  s[0x14] = (uchar)(iVar8 >> 7);
  s[0x15] = (uchar)(iVar8 >> 0xf);
  s[0x16] = (byte)(iVar8 >> 0x17) | (char)iVar9 * '\b';
  s[0x17] = (uchar)(iVar9 >> 5);
  s[0x18] = (uchar)(iVar9 >> 0xd);
  s[0x19] = (byte)(iVar9 >> 0x15) | (char)iVar10 * '\x10';
  s[0x1a] = (uchar)(iVar10 >> 4);
  s[0x1b] = (uchar)(iVar10 >> 0xc);
  s[0x1c] = (byte)(iVar10 >> 0x14) | (char)iVar11 * '@';
  s[0x1d] = (uchar)(iVar11 >> 2);
  s[0x1e] = (uchar)(iVar11 >> 10);
  s[0x1f] = (uchar)(iVar11 >> 0x12);
  return;
}

Assistant:

void fe_tobytes(unsigned char *s, const fe h) {
    i32 h0 = h[0];
    i32 h1 = h[1];
    i32 h2 = h[2];
    i32 h3 = h[3];
    i32 h4 = h[4];
    i32 h5 = h[5];
    i32 h6 = h[6];
    i32 h7 = h[7];
    i32 h8 = h[8];
    i32 h9 = h[9];
    i32 q;
    i32 carry0;
    i32 carry1;
    i32 carry2;
    i32 carry3;
    i32 carry4;
    i32 carry5;
    i32 carry6;
    i32 carry7;
    i32 carry8;
    i32 carry9;
    q = (19 * h9 + (((i32) 1) << 24)) >> 25;
    q = (h0 + q) >> 26;
    q = (h1 + q) >> 25;
    q = (h2 + q) >> 26;
    q = (h3 + q) >> 25;
    q = (h4 + q) >> 26;
    q = (h5 + q) >> 25;
    q = (h6 + q) >> 26;
    q = (h7 + q) >> 25;
    q = (h8 + q) >> 26;
    q = (h9 + q) >> 25;
    /* Goal: Output h-(2^255-19)q, which is between 0 and 2^255-20. */
    h0 += 19 * q;
    /* Goal: Output h-2^255 q, which is between 0 and 2^255-20. */
    carry0 = h0 >> 26;
    h1 += carry0;
    h0 -= shift_left(carry0, 26);
    carry1 = h1 >> 25;
    h2 += carry1;
    h1 -= shift_left(carry1, 25);
    carry2 = h2 >> 26;
    h3 += carry2;
    h2 -= shift_left(carry2, 26);
    carry3 = h3 >> 25;
    h4 += carry3;
    h3 -= shift_left(carry3, 25);
    carry4 = h4 >> 26;
    h5 += carry4;
    h4 -= shift_left(carry4, 26);
    carry5 = h5 >> 25;
    h6 += carry5;
    h5 -= shift_left(carry5, 25);
    carry6 = h6 >> 26;
    h7 += carry6;
    h6 -= shift_left(carry6, 26);
    carry7 = h7 >> 25;
    h8 += carry7;
    h7 -= shift_left(carry7, 25);
    carry8 = h8 >> 26;
    h9 += carry8;
    h8 -= shift_left(carry8, 26);
    carry9 = h9 >> 25;
    h9 -= shift_left(carry9, 25);

    /* h10 = carry9 */
    /*
    Goal: Output h0+...+2^255 h10-2^255 q, which is between 0 and 2^255-20.
    Have h0+...+2^230 h9 between 0 and 2^255-1;
    evidently 2^255 h10-2^255 q = 0.
    Goal: Output h0+...+2^230 h9.
    */
    s[0] = (unsigned char) ((h0 >> 0) & 0xff);
    s[1] = (unsigned char) ((h0 >> 8) & 0xff);
    s[2] = (unsigned char) ((h0 >> 16) & 0xff);
    s[3] = (unsigned char) (((h0 >> 24) | (h1 << 2)) & 0xff);
    s[4] = (unsigned char) ((h1 >> 6) & 0xff);
    s[5] = (unsigned char) ((h1 >> 14) & 0xff);
    s[6] = (unsigned char) (((h1 >> 22) | (h2 << 3)) & 0xff);
    s[7] = (unsigned char) ((h2 >> 5) & 0xff);
    s[8] = (unsigned char) ((h2 >> 13) & 0xff);
    s[9] = (unsigned char) (((h2 >> 21) | (h3 << 5)) & 0xff);
    s[10] = (unsigned char) ((h3 >> 3) & 0xff);
    s[11] = (unsigned char) ((h3 >> 11) & 0xff);
    s[12] = (unsigned char) (((h3 >> 19) | (h4 << 6)) & 0xff);
    s[13] = (unsigned char) ((h4 >> 2) & 0xff);
    s[14] = (unsigned char) ((h4 >> 10) & 0xff);
    s[15] = (unsigned char) ((h4 >> 18) & 0xff);
    s[16] = (unsigned char) ((h5 >> 0) & 0xff);
    s[17] = (unsigned char) ((h5 >> 8) & 0xff);
    s[18] = (unsigned char) ((h5 >> 16) & 0xff);
    s[19] = (unsigned char) (((h5 >> 24) | (h6 << 1)) & 0xff);
    s[20] = (unsigned char) ((h6 >> 7) & 0xff);
    s[21] = (unsigned char) ((h6 >> 15) & 0xff);
    s[22] = (unsigned char) (((h6 >> 23) | (h7 << 3)) & 0xff);
    s[23] = (unsigned char) ((h7 >> 5) & 0xff);
    s[24] = (unsigned char) ((h7 >> 13) & 0xff);
    s[25] = (unsigned char) (((h7 >> 21) | (h8 << 4)) & 0xff);
    s[26] = (unsigned char) ((h8 >> 4) & 0xff);
    s[27] = (unsigned char) ((h8 >> 12) & 0xff);
    s[28] = (unsigned char) (((h8 >> 20) | (h9 << 6)) & 0xff);
    s[29] = (unsigned char) ((h9 >> 2) & 0xff);
    s[30] = (unsigned char) ((h9 >> 10) & 0xff);
    s[31] = (unsigned char) ((h9 >> 18) & 0xff);
}